

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O2

uint64_t pstore::varint::details::decode9<unsigned_char*>(uchar *in)

{
  uint64_t uVar1;
  ulong uVar2;
  byte *pbVar3;
  
  pbVar3 = in + 1;
  uVar1 = 0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 8) {
    uVar1 = uVar1 | (ulong)*pbVar3 << ((byte)uVar2 & 0x3f);
    pbVar3 = pbVar3 + 1;
  }
  return uVar1;
}

Assistant:

std::uint64_t decode9 (InputIterator in) {
                ++in; // skip the length byte
                auto result = std::uint64_t{0};
                for (auto shift = 0U; shift < 64U; shift += 8U) {
                    result |= std::uint64_t{*(in++)} << shift;
                }
                return result;
            }